

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O3

Vec_Wrd_t * Pla_ManFxMinimize(word *pOn,int nVars)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  Vec_Wrd_t *pVVar4;
  word *__ptr;
  void *__ptr_00;
  Vec_Int_t *p;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int Count_1;
  word wVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int i;
  uint uVar19;
  int Count [32];
  int pDirs [32];
  int local_1e4;
  int local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_138 [32];
  uint local_b8;
  byte local_b4;
  
  uVar17 = 1 << ((byte)nVars & 0x1f);
  uVar18 = ((int)uVar17 >> 6) + (uint)((uint)nVars < 6);
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  __ptr = (word *)malloc(8000);
  pVVar4->pArray = __ptr;
  __ptr_00 = calloc((long)(int)uVar18,8);
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p->pArray = piVar5;
  if (nVars == 0x1f) {
    local_1b8 = local_1b8 & 0xffffffff00000000;
  }
  else {
    uVar19 = 1;
    if (1 < (int)uVar17) {
      uVar19 = uVar17;
    }
    local_1c8 = 0;
    uVar6 = 0;
    iVar2 = 0;
    do {
      uVar13 = (uint)uVar6;
      uVar11 = uVar6 >> 6;
      uVar8 = 1L << ((byte)uVar6 & 0x3f);
      if (((pOn[uVar11] >> (uVar6 & 0x3f) & 1) != 0) &&
         (uVar6 = *(ulong *)((long)__ptr_00 + uVar11 * 8), (uVar6 & uVar8) == 0)) {
        if (nVars < 1) {
          local_138[0] = local_138[0] + 1;
LAB_00370bb1:
          *(ulong *)((long)__ptr_00 + uVar11 * 8) = uVar6 | uVar8;
          iVar2 = iVar2 + 1;
          uVar12 = 0xffffffff;
LAB_00370bef:
          Vec_IntPush(p,uVar13);
          Vec_IntPush(p,uVar12);
        }
        else {
          iVar7 = 0;
          uVar12 = 0;
          do {
            uVar14 = uVar13 ^ 1 << (uVar12 & 0x1f);
            if ((pOn[(int)uVar14 >> 6] >> ((ulong)uVar14 & 0x3f) & 1) != 0) {
              lVar9 = (long)iVar7;
              iVar7 = iVar7 + 1;
              (&local_b8)[lVar9] = uVar12;
            }
            uVar12 = uVar12 + 1;
          } while (nVars != uVar12);
          local_138[iVar7] = local_138[iVar7] + 1;
          if (iVar7 == 2) {
            uVar12 = 1 << ((byte)local_b8 & 0x1f) ^ 1 << (local_b4 & 0x1f) ^ uVar13;
            if ((pOn[(int)uVar12 >> 6] >> ((ulong)uVar12 & 0x3f) & 1) != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                            ,0xdb,"Vec_Wrd_t *Pla_ManFxMinimize(word *, int)");
            }
          }
          else {
            if (iVar7 == 1) {
              uVar12 = uVar13 ^ 1 << (local_b8 & 0x1f);
              *(ulong *)((long)__ptr_00 + uVar11 * 8) = uVar6 | uVar8;
              puVar1 = (ulong *)((long)__ptr_00 + (long)((int)uVar12 >> 6) * 8);
              *puVar1 = *puVar1 | 1L << ((byte)uVar12 & 0x3f);
              local_1c8 = local_1c8 + 1;
              uVar12 = local_b8;
              goto LAB_00370bef;
            }
            if (iVar7 == 0) goto LAB_00370bb1;
          }
        }
      }
      uVar6 = (ulong)(uVar13 + 1);
    } while (uVar13 + 1 != uVar19);
    local_1b8 = CONCAT44(local_1c8,iVar2);
    if (nVars != 0x1f) {
      uVar19 = 1;
      if (1 < (int)uVar17) {
        uVar19 = uVar17;
      }
      local_1e4 = 0;
      uVar6 = 0;
      do {
        uVar17 = (uint)uVar6;
        uVar11 = uVar6 >> 6;
        uVar8 = 1L << ((byte)uVar6 & 0x3f);
        if (((pOn[uVar11] >> (uVar6 & 0x3f) & 1) != 0) &&
           (uVar6 = *(ulong *)((long)__ptr_00 + uVar11 * 8), (uVar6 & uVar8) == 0)) {
          uVar13 = 0;
          if (nVars < 1) {
LAB_00370d56:
            uVar12 = 0;
          }
          else {
            uVar12 = 0;
            do {
              uVar14 = uVar17 ^ 1 << (uVar12 & 0x1f);
              if ((pOn[(int)uVar14 >> 6] >> ((ulong)uVar14 & 0x3f) & 1) != 0) {
                lVar9 = (long)(int)uVar13;
                uVar13 = uVar13 + 1;
                (&local_b8)[lVar9] = uVar12;
              }
              uVar12 = uVar12 + 1;
            } while (nVars != uVar12);
            if ((int)uVar13 < 1) goto LAB_00370d56;
            uVar15 = 0;
            do {
              uVar12 = uVar17 ^ 1 << ((byte)(&local_b8)[uVar15] & 0x1f);
              if (((pOn[(int)uVar12 >> 6] >> ((ulong)uVar12 & 0x3f) & 1) != 0) &&
                 (uVar16 = uVar15,
                 (*(ulong *)((long)__ptr_00 + (long)((int)uVar12 >> 6) * 8) &
                 1L << ((byte)uVar12 & 0x3f)) == 0)) break;
              uVar15 = uVar15 + 1;
              uVar16 = (ulong)uVar13;
            } while (uVar13 != uVar15);
            uVar12 = (uint)uVar16;
          }
          if (uVar12 == uVar13) {
            uVar12 = 0;
          }
          uVar13 = (&local_b8)[uVar12];
          uVar12 = uVar17 ^ 1 << (uVar13 & 0x1f);
          *(ulong *)((long)__ptr_00 + uVar11 * 8) = uVar6 | uVar8;
          puVar1 = (ulong *)((long)__ptr_00 + (long)((int)uVar12 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar12 & 0x3f);
          local_1e4 = local_1e4 + 1;
          Vec_IntPush(p,uVar17);
          Vec_IntPush(p,uVar13);
        }
        uVar6 = (ulong)(uVar17 + 1);
      } while (uVar17 + 1 != uVar19);
      uStack_190 = CONCAT44(uStack_190._4_4_,local_1e4);
    }
  }
  putchar(10);
  if ((int)uVar18 < 1) {
    printf("Truth = %d. ",0);
  }
  else {
    uVar6 = 0;
    uVar11 = 0;
    do {
      uVar8 = pOn[uVar6] - (pOn[uVar6] >> 1 & 0x5555555555555555);
      uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
      uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f;
      uVar8 = (uVar8 >> 8) + uVar8;
      lVar9 = (uVar8 >> 0x10) + uVar8;
      uVar11 = (ulong)((int)uVar11 + ((int)((ulong)lVar9 >> 0x20) + (int)lVar9 & 0xffU));
      uVar6 = uVar6 + 1;
    } while (uVar18 != uVar6);
    uVar6 = 0;
    printf("Truth = %d. ",uVar11);
    do {
      uVar6 = uVar6 + 1;
    } while (uVar18 != uVar6);
  }
  printf("Cover = %d. ");
  putchar(10);
  printf("Count: ");
  lVar9 = 0;
  do {
    if (local_138[lVar9] != 0) {
      printf("%d=%d ");
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  putchar(10);
  printf("Cubes: ");
  lVar9 = 0;
  do {
    if (*(int *)((long)&local_1b8 + lVar9 * 4) != 0) {
      printf("%d=%d ");
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  putchar(10);
  iVar2 = p->nSize;
  piVar5 = p->pArray;
  if (1 < iVar2) {
    iVar7 = 1000;
    lVar9 = 0;
    uVar6 = 0;
    do {
      if (nVars < 1) {
        wVar10 = 0;
      }
      else {
        uVar17 = 0;
        uVar18 = 0;
        wVar10 = 0;
        do {
          if (piVar5[lVar9 + 1] != uVar18) {
            if (((uint)piVar5[lVar9] >> (uVar18 & 0x1f) & 1) == 0) {
              wVar10 = wVar10 | 1L << (uVar17 & 0x3e);
            }
            else {
              wVar10 = wVar10 | 2L << (sbyte)(uVar17 & 0x3e);
            }
          }
          uVar18 = uVar18 + 1;
          uVar17 = uVar17 + 2;
        } while (nVars != uVar18);
      }
      iVar3 = iVar7;
      if (iVar7 == (int)uVar6) {
        if (uVar6 < 0x10) {
          if (__ptr == (word *)0x0) {
            __ptr = (word *)malloc(0x80);
          }
          else {
            __ptr = (word *)realloc(__ptr,0x80);
          }
          pVVar4->pArray = __ptr;
          iVar3 = 0x10;
          if (__ptr == (word *)0x0) {
LAB_003710dc:
            pVVar4->nSize = iVar7;
            pVVar4->nCap = iVar7;
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
        }
        else {
          if (__ptr == (word *)0x0) {
            __ptr = (word *)malloc(uVar6 << 4);
          }
          else {
            __ptr = (word *)realloc(__ptr,uVar6 << 4);
          }
          pVVar4->pArray = __ptr;
          if (__ptr == (word *)0x0) goto LAB_003710dc;
          iVar3 = (int)uVar6 * 2;
        }
      }
      iVar7 = iVar3;
      __ptr[uVar6] = wVar10;
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + 2;
    } while ((int)((uint)lVar9 | 1) < iVar2);
    pVVar4->nSize = (int)uVar6;
    pVVar4->nCap = iVar7;
    piVar5 = p->pArray;
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(p);
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  return pVVar4;
}

Assistant:

Vec_Wrd_t * Pla_ManFxMinimize( word * pOn, int nVars )
{
    int i, v, iMint, iVar, nMints = (1 << nVars);
    int nWords = Abc_Bit6WordNum( nMints );
    Vec_Wrd_t * vCubes = Vec_WrdAlloc( 1000 );
    word * pDc = ABC_CALLOC( word, nWords );
    int Count[32] = {0};
    int Cubes[32] = {0};
    Vec_Int_t * vStore = Vec_IntAlloc( 1000 );

    // count the number of expansion directions
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) && !Pla_TtGetBit(pDc, i) )
        {
            int pDirs[32], nDirs = Pla_ManExpendDirNum(pOn, nVars, i, pDirs);
            Count[nDirs]++;
            if ( nDirs == 0 )
            {
                Pla_TtSetBit(pDc, i);
                Cubes[0]++;
                // save
                Vec_IntPushTwo( vStore, i, -1 );
                continue;
            }
            if ( nDirs == 1 )
            {
                //Pla_PrintBinary( (word *)&i, nVars );
                //printf( " %d \n", pDirs[0] );

                Pla_TtSetBit(pDc, i);
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]));
                Cubes[1]++;
                // save
                Vec_IntPushTwo( vStore, i, pDirs[0] );
                continue;
            }
            if ( nDirs == 2 && Pla_TtGetBit(pOn, i ^ (1 << pDirs[0]) ^ (1 << pDirs[1])) )
            {
                assert( 0 );
                Pla_TtSetBit(pDc, i);
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]));
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[1]));
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]) ^ (1 << pDirs[1]));
                Cubes[2]++;
                continue;
            }
        }

    // go through the remaining cubes
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) && !Pla_TtGetBit(pDc, i) )
        {
            int pDirs[32], nDirs = Pla_ManExpendDirNum(pOn, nVars, i, pDirs);
            // find direction, which is not taken
            for ( v = 0; v < nDirs; v++ )
                if ( Pla_TtGetBit(pOn, i ^ (1 << pDirs[v])) && !Pla_TtGetBit(pDc, i ^ (1 << pDirs[v])) )
                    break;
            // if there is no open directions, use any one
            if ( v == nDirs )
                v = 0;
            // mark this one
            Pla_TtSetBit(pDc, i);
            Pla_TtSetBit(pDc, i ^ (1 << pDirs[v]));
            Cubes[10]++;
            // save
            Vec_IntPushTwo( vStore, i, pDirs[v] );
            continue;
        }

    printf( "\n" );
    printf( "Truth = %d. ", Pla_TtCountOnes(pOn, nWords) );
    printf( "Cover = %d. ", Pla_TtCountOnes(pDc, nWords) );
    printf( "\n" );

    printf( "Count: " );
    for ( i = 0; i < 16; i++ )
        if ( Count[i] )
            printf( "%d=%d ", i, Count[i] );
    printf( "\n" );

    printf( "Cubes: " );
    for ( i = 0; i < 16; i++ )
        if ( Cubes[i] )
            printf( "%d=%d ", i, Cubes[i] );
    printf( "\n" );

/*
    // extract cubes one at a time
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) )
        {
            word Cube = 0;
            for ( v = 0; v < nVars; v++ )
                if ( (i >> v) & 1 )
                    Pla_CubeSetLit( &Cube, v, PLA_LIT_ONE );
                else
                    Pla_CubeSetLit( &Cube, v, PLA_LIT_ZERO );
            Vec_WrdPush( vCubes, Cube );
        }
*/
    Vec_IntForEachEntryDouble( vStore, iMint, iVar, i )
    {
        word Cube = 0;
        for ( v = 0; v < nVars; v++ )
        {
            if ( v == iVar )
                continue;
            if ( (iMint >> v) & 1 )
                Pla_CubeSetLit( &Cube, v, PLA_LIT_ONE );
            else
                Pla_CubeSetLit( &Cube, v, PLA_LIT_ZERO );
        }
        Vec_WrdPush( vCubes, Cube );
    }
    Vec_IntFree( vStore );

    // collect the minterms
    ABC_FREE( pDc );
    return vCubes;
}